

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall
QMdiSubWindow::contextMenuEvent(QMdiSubWindow *this,QContextMenuEvent *contextMenuEvent)

{
  bool bVar1;
  QMdiSubWindowPrivate *pQVar2;
  QEvent *in_RSI;
  long in_FS_OFFSET;
  QPoint *unaff_retaddr;
  QMenu *in_stack_00000008;
  QMdiSubWindowPrivate *d;
  byte local_2a;
  QRegion local_10;
  QAction *action;
  
  action = *(QAction **)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QMdiSubWindow *)0x6371ba);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QMenu> *)0x6371d0);
  if (bVar1) {
    local_2a = 1;
    if (pQVar2->hoveredSubControl != SC_ComboBoxFrame) {
      QMdiSubWindowPrivate::getRegion((QMdiSubWindowPrivate *)contextMenuEvent,d._4_4_);
      QContextMenuEvent::pos((QContextMenuEvent *)in_RSI);
      local_2a = QRegion::contains((QPoint *)&local_10);
      QRegion::~QRegion(&local_10);
    }
    if ((local_2a & 1) == 0) {
      QEvent::ignore(in_RSI);
    }
    else {
      QPointer<QMenu>::operator->((QPointer<QMenu> *)0x637268);
      QContextMenuEvent::globalPos((QContextMenuEvent *)in_RSI);
      QMenu::exec(in_stack_00000008,unaff_retaddr,action);
    }
  }
  else {
    QEvent::ignore(in_RSI);
  }
  if (*(QAction **)(in_FS_OFFSET + 0x28) == action) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::contextMenuEvent(QContextMenuEvent *contextMenuEvent)
{
    Q_D(QMdiSubWindow);
    if (!d->systemMenu) {
        contextMenuEvent->ignore();
        return;
    }

    if (d->hoveredSubControl == QStyle::SC_TitleBarSysMenu
            || d->getRegion(QMdiSubWindowPrivate::Move).contains(contextMenuEvent->pos())) {
        d->systemMenu->exec(contextMenuEvent->globalPos());
    } else {
        contextMenuEvent->ignore();
    }
}